

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_queue_stdlib.cc
# Opt level: O0

void __thiscall dd::TaskQueueStdlib::ProcessTasks(TaskQueueStdlib *this)

{
  bool bVar1;
  uint uVar2;
  pointer pQVar3;
  QueuedTask *release_ptr;
  undefined1 local_28 [8];
  NextTask task;
  TaskQueueStdlib *this_local;
  
  task._sleep_time_ms = (int64_t)this;
  Event::Set(&this->_started);
  do {
    GetNextTask((NextTask *)local_28,this);
    if ((local_28[0] & 1U) == 0) {
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&task);
      if (bVar1) {
        pQVar3 = std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>::release
                           ((unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_> *)
                            &task);
        uVar2 = (*pQVar3->_vptr_QueuedTask[2])();
        if (((uVar2 & 1) != 0) && (pQVar3 != (pointer)0x0)) {
          (*pQVar3->_vptr_QueuedTask[1])();
        }
        release_ptr._4_4_ = 2;
      }
      else {
        if (CONCAT44(task._run_task._M_t.
                     super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>.
                     super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl._4_4_,
                     (int)task._run_task._M_t.
                          super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>
                          .super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl) == 0) {
          Event::Wait(&this->_flag_notify,-1);
        }
        else {
          Event::Wait(&this->_flag_notify,
                      (int)task._run_task._M_t.
                           super___uniq_ptr_impl<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_dd::QueuedTask_*,_std::default_delete<dd::QueuedTask>_>
                           .super__Head_base<0UL,_dd::QueuedTask_*,_false>._M_head_impl);
        }
        release_ptr._4_4_ = 0;
      }
    }
    else {
      release_ptr._4_4_ = 3;
    }
    NextTask::~NextTask((NextTask *)local_28);
  } while ((release_ptr._4_4_ == 0) || (release_ptr._4_4_ == 2));
  DrainTasks(this);
  Event::Set(&this->_stopped);
  return;
}

Assistant:

void TaskQueueStdlib::ProcessTasks()
	{
		_started.Set();
		while (true) {
			auto task = GetNextTask();
			if (task._final_task)
				break;
			if (task._run_task) {
				QueuedTask* release_ptr = task._run_task.release();
				if (release_ptr->Run())
					delete release_ptr;
				continue;
			}

			if (0 == task._sleep_time_ms)
				_flag_notify.Wait(Event::kForever);
			else
				_flag_notify.Wait(task._sleep_time_ms);
		}
		DrainTasks();
		_stopped.Set();
	}